

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::CheckFreeBitVector
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool isCollecting)

{
  ushort uVar1;
  code *pcVar2;
  anon_class_24_3_3b104623 fn;
  bool bVar3;
  BOOLEAN BVar4;
  ushort uVar5;
  uint bitIndex_00;
  BVIndex BVar6;
  uint uVar7;
  SmallHeapBlockBitVector *pSVar8;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  undefined8 *in_FS_OFFSET;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *finalizableBlock;
  FreeObject *pFStack_138;
  uint bitIndex;
  FreeObject *freeObject;
  undefined1 local_128 [4];
  uint verifyFreeCount;
  SmallHeapBlockBitVector temp;
  SmallHeapBlockBitVector *free;
  FreeObject *freeObjectList;
  bool isCollecting_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  if ((isCollecting) ||
     ((*(this->super_HeapBlock)._vptr_HeapBlock[0x10])(),
     free == (SmallHeapBlockBitVector *)this->freeObjectList)) {
    temp.data[0x1f].word = (Type)GetFreeBitVector(this);
    BVStatic<2048UL>::BVStatic((BVStatic<2048UL> *)local_128);
    BVStatic<2048UL>::Copy((BVStatic<2048UL> *)local_128,(BVStatic<2048UL> *)temp.data[0x1f].word);
    pSVar8 = GetInvalidBitVector(this);
    BVStatic<2048UL>::And((BVStatic<2048UL> *)local_128,pSVar8);
    bVar3 = BVStatic<2048UL>::IsAllClear((BVStatic<2048UL> *)local_128);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x71d,"(temp.IsAllClear())","temp.IsAllClear()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    freeObject._4_4_ = 0;
    for (pFStack_138 = this->freeObjectList; pFStack_138 != (FreeObject *)0x0;
        pFStack_138 = FreeObject::GetNext(pFStack_138)) {
      uVar5 = GetAddressBitIndex(pFStack_138);
      bitIndex_00 = (uint)uVar5;
      bVar3 = IsValidBitIndex(this,bitIndex_00);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x724,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      pSVar8 = GetDebugFreeBitVector(this);
      BVar4 = BVStatic<2048UL>::Test(pSVar8,bitIndex_00);
      if (BVar4 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x725,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      BVar4 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)temp.data[0x1f].word,bitIndex_00);
      if (BVar4 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x726,"(free->Test(bitIndex))","free->Test(bitIndex)");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      freeObject._4_4_ = freeObject._4_4_ + 1;
    }
    pSVar8 = GetDebugFreeBitVector(this);
    BVar6 = BVStatic<2048UL>::Count(pSVar8);
    if (BVar6 != freeObject._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x72b,"(this->GetDebugFreeBitVector()->Count() == verifyFreeCount)",
                         "this->GetDebugFreeBitVector()->Count() == verifyFreeCount");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    uVar1 = this->freeCount;
    pSVar8 = GetFreeBitVector(this);
    BVar6 = BVStatic<2048UL>::Count(pSVar8);
    if (uVar1 != BVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x72c,"(this->freeCount == this->GetFreeBitVector()->Count())",
                         "this->freeCount == this->GetFreeBitVector()->Count()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    bVar3 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
    if (bVar3) {
      this_00 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                          (&this->super_HeapBlock);
      fn.free = (SmallHeapBlockBitVector **)(temp.data + 0x1f);
      fn.this = this;
      fn.verifyFreeCount = (uint *)((long)&freeObject + 4);
      SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
      ForEachPendingDisposeObject<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::CheckFreeBitVector(bool)::_lambda(unsigned_int)_1_>
                (this_00,fn);
      uVar7 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
              CheckDisposedObjectFreeBitVector(this_00);
      freeObject._4_4_ = uVar7 + freeObject._4_4_;
    }
    if (freeObject._4_4_ != this->freeCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x73f,"(verifyFreeCount == this->freeCount)",
                         "verifyFreeCount == this->freeCount");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    if (this->lastFreeCount < freeObject._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x740,"(verifyFreeCount <= this->lastFreeCount)",
                         "verifyFreeCount <= this->lastFreeCount");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    bVar3 = IsFreeBitsValid(this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x741,"(this->IsFreeBitsValid())","this->IsFreeBitsValid()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  else {
    CheckDebugFreeBitVector(this,false);
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::CheckFreeBitVector(bool isCollecting)
{
    // during collection, the heap block has the current info when we are verifying
    if (!isCollecting)
    {
        FreeObject * freeObjectList;
        this->GetFreeObjectListOnAllocator(&freeObjectList);
        if (freeObjectList != this->freeObjectList)
        {
            // allocator has the current info and if we have already allocated some memory,
            // the free bit vector isn't really correct, so we can't verify it.
            // Just verify the debug free bit vector
            this->CheckDebugFreeBitVector(false);
            return;
        }
    }

    SmallHeapBlockBitVector * free = this->GetFreeBitVector();

    // Shouldn't be any invalid bits set in the free bit vector
    SmallHeapBlockBitVector temp;
    temp.Copy(free);
    temp.And(this->GetInvalidBitVector());
    Assert(temp.IsAllClear());

    uint verifyFreeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        Assert(free->Test(bitIndex));
        verifyFreeCount++;

        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == verifyFreeCount);
    Assert(this->freeCount == this->GetFreeBitVector()->Count());

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));
            verifyFreeCount++;
        });

        // Include disposed objects
        verifyFreeCount += finalizableBlock->CheckDisposedObjectFreeBitVector();
    }

    Assert(verifyFreeCount == this->freeCount);
    Assert(verifyFreeCount <= this->lastFreeCount);
    Assert(this->IsFreeBitsValid());
}